

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::clear(HEkk *this)

{
  HEkk *in_RDI;
  
  clearEkkLp(in_RDI);
  clearEkkDualize(in_RDI);
  clearEkkData(in_RDI);
  clearEkkDualEdgeWeightData(in_RDI);
  clearEkkPointers(in_RDI);
  SimplexBasis::clear((SimplexBasis *)in_RDI);
  HSimplexNla::clear(&in_RDI->simplex_nla_);
  clearEkkAllStatus(in_RDI);
  clearRayRecords(in_RDI);
  return;
}

Assistant:

void HEkk::clear() {
  // Clears Ekk entirely. Clears all associated pointers, data scalars
  // and vectors, and the status values.
  this->clearEkkLp();
  this->clearEkkDualize();
  this->clearEkkData();
  this->clearEkkDualEdgeWeightData();
  this->clearEkkPointers();
  this->basis_.clear();
  this->simplex_nla_.clear();
  this->clearEkkAllStatus();
  this->clearRayRecords();
}